

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O1

ChLoad<chrono::ChLoaderGravity> * __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::Clone(ChLoad<chrono::ChLoaderGravity> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChLoad<chrono::ChLoaderGravity> *this_00;
  
  this_00 = (ChLoad<chrono::ChLoaderGravity> *)operator_new(0x88);
  chrono::ChObj::ChObj((ChObj *)this_00,(ChObj *)this);
  *(code **)this_00 = chrono::ChLoadCustom::LoadGetStateBlock_w;
  *(undefined8 *)&this_00->field_0x38 = *(undefined8 *)&this->field_0x38;
  *(undefined ***)this_00 = &PTR__ChLoad_00138f10;
  (this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoader_00138bd8;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)
             &(this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q,
             (DenseStorage<double,__1,__1,_1,_0> *)
             &(this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q);
  (this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_001390d8;
  (this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
  super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
       super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
  super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_00138fe0;
  (this_00->loader).G_acc.m_data[0] = (this->loader).G_acc.m_data[0];
  (this_00->loader).G_acc.m_data[1] = (this->loader).G_acc.m_data[1];
  (this_00->loader).G_acc.m_data[2] = (this->loader).G_acc.m_data[2];
  (this_00->loader).num_int_points = (this->loader).num_int_points;
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }